

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyTextToken(Lexer *lexer)

{
  uint uVar1;
  Node *pNVar2;
  
  pNVar2 = prvTidyNewNode(lexer->allocator,lexer);
  uVar1 = lexer->txtend;
  pNVar2->start = lexer->txtstart;
  pNVar2->end = uVar1;
  return pNVar2;
}

Assistant:

Node* TY_(TextToken)( Lexer *lexer )
{
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    node->start = lexer->txtstart;
    node->end = lexer->txtend;
    return node;
}